

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O0

Matrix<double,_3,_3> *
tcu::operator*(Matrix<double,_3,_3> *__return_storage_ptr__,Matrix<double,_3,_3> *a,
              Matrix<double,_3,_3> *b)

{
  double dVar1;
  double *pdVar2;
  undefined4 local_3c;
  double dStack_38;
  int ndx;
  double v;
  undefined4 local_28;
  int col;
  int row;
  Matrix<double,_3,_3> *b_local;
  Matrix<double,_3,_3> *a_local;
  Matrix<double,_3,_3> *res;
  
  Matrix<double,_3,_3>::Matrix(__return_storage_ptr__);
  for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
    for (v._4_4_ = 0; v._4_4_ < 3; v._4_4_ = v._4_4_ + 1) {
      dStack_38 = 0.0;
      for (local_3c = 0; local_3c < 3; local_3c = local_3c + 1) {
        pdVar2 = Matrix<double,_3,_3>::operator()(a,local_28,local_3c);
        dVar1 = *pdVar2;
        pdVar2 = Matrix<double,_3,_3>::operator()(b,local_3c,v._4_4_);
        dStack_38 = dVar1 * *pdVar2 + dStack_38;
      }
      pdVar2 = Matrix<double,_3,_3>::operator()(__return_storage_ptr__,local_28,v._4_4_);
      *pdVar2 = dStack_38;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}